

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_wc.cpp
# Opt level: O3

bool __thiscall CmdWc::Execute(CmdWc *this)

{
  StrList *pSVar1;
  _List_node_base *p_Var2;
  string *p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  FileType FVar9;
  long *plVar10;
  ostream *poVar11;
  size_type *psVar12;
  long lVar13;
  bool bVar14;
  char *pcVar15;
  _List_node_base *p_Var16;
  ifstream fin;
  int local_28c;
  int local_288;
  int local_284;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  CmdWc *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [3];
  ostream local_1c0 [400];
  
  if ((this->super_Command).parameter.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size == 0) {
    pcVar15 = "error";
    lVar13 = 5;
    poVar11 = (ostream *)&std::cout;
LAB_0010b044:
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar15,lVar13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    bVar14 = false;
  }
  else {
    local_260 = this;
    if ((this->super_Command).option.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size == 0) {
      bVar5 = true;
      bVar4 = true;
      bVar6 = true;
    }
    else {
      pSVar1 = &(this->super_Command).option;
      p_Var16 = (pSVar1->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var16 == (_List_node_base *)pSVar1) {
        bVar5 = false;
        bVar4 = false;
        bVar6 = false;
      }
      else {
        bVar6 = false;
        bVar4 = false;
        bVar5 = false;
        do {
          p_Var2 = p_Var16 + 1;
          iVar8 = std::__cxx11::string::compare((char *)p_Var2);
          if (iVar8 == 0) {
            bVar6 = true;
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)p_Var2);
            if (iVar8 == 0) {
              bVar5 = true;
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)p_Var2);
              bVar4 = true;
              if (iVar8 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"wc: invalid option -- \'",0x17);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)p_Var16[1]._M_next,
                                     (long)p_Var16[1]._M_prev);
                pcVar15 = "\'";
                lVar13 = 1;
                goto LAB_0010b044;
              }
            }
          }
          p_Var16 = p_Var16->_M_next;
        } while (p_Var16 != (_List_node_base *)pSVar1);
      }
    }
    pSVar1 = &(local_260->super_Command).parameter;
    p_Var16 = (pSVar1->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var16 == (_List_node_base *)pSVar1) {
      local_28c = 0;
      local_288 = 0;
      local_284 = 0;
    }
    else {
      paVar3 = &local_238[0].field_2;
      local_284 = 0;
      local_288 = 0;
      local_28c = 0;
      do {
        p = (string *)(p_Var16 + 1);
        FVar9 = DirUtils::GetFileType(p);
        if (FVar9 == DU_DIRECTORY) {
          std::operator+(&local_280,"wc: ",p);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_280);
          psVar12 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_238[0].field_2._0_8_ = *psVar12;
            local_238[0].field_2._8_8_ = plVar10[3];
            local_238[0]._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_238[0].field_2._0_8_ = *psVar12;
            local_238[0]._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_238[0]._M_string_length = plVar10[1];
          *plVar10 = (long)psVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                               local_238[0]._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._M_dataplus._M_p != paVar3) {
            operator_delete(local_238[0]._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p);
          }
          std::operator+(local_238,"0 0 0 ",p);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                               local_238[0]._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._M_dataplus._M_p != paVar3) {
            operator_delete(local_238[0]._M_dataplus._M_p);
          }
        }
        else {
          std::ifstream::ifstream(local_238,(p->_M_dataplus)._M_p,_S_bin);
          poVar11 = local_1c0;
          cVar7 = std::__basic_file<char>::is_open();
          if (cVar7 == '\0') {
            std::operator+(&local_258,"wc: ",p);
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_258);
            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
            psVar12 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_280.field_2._M_allocated_capacity = *psVar12;
              local_280.field_2._8_8_ = plVar10[3];
            }
            else {
              local_280.field_2._M_allocated_capacity = *psVar12;
              local_280._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_280._M_string_length = plVar10[1];
            *plVar10 = (long)psVar12;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_280._M_dataplus._M_p,
                                 local_280._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p);
            }
          }
          else {
            if (bVar4) {
              iVar8 = CntLine((CmdWc *)poVar11,p);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
              local_280._M_dataplus._M_p._0_1_ = 0x20;
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_280,1);
              local_284 = local_284 + iVar8;
            }
            if (bVar5) {
              iVar8 = CntWord((CmdWc *)poVar11,p);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
              local_280._M_dataplus._M_p._0_1_ = 0x20;
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_280,1);
              local_288 = local_288 + iVar8;
            }
            if (bVar6) {
              iVar8 = CntByte((CmdWc *)poVar11,p);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
              local_280._M_dataplus._M_p._0_1_ = 0x20;
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_280,1);
              local_28c = local_28c + iVar8;
            }
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)p_Var16[1]._M_next,
                                 (long)p_Var16[1]._M_prev);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
          }
          std::ifstream::~ifstream(local_238);
        }
        p_Var16 = p_Var16->_M_next;
      } while (p_Var16 != (_List_node_base *)pSVar1);
    }
    bVar14 = true;
    if (1 < (local_260->super_Command).parameter.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size) {
      if (bVar4) {
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_284);
        local_238[0]._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_238,1);
      }
      if (bVar5) {
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_288);
        local_238[0]._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_238,1);
      }
      if (bVar6) {
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_28c);
        local_238[0]._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_238,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"total",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
    }
  }
  return bVar14;
}

Assistant:

bool CmdWc::Execute(){
	if(parameter.size() == 0){
		cout << "error" << endl;
		return false;
	}
	bool byteActive = false, wordActive = false, lineActive = false;
	if(option.size() == 0){
		byteActive = wordActive = lineActive = true;
	}
	else{
		for(auto i = option.begin(); i != option.end(); i++){
			if((*i) == "-c")byteActive = true;
			else if((*i) == "-w")wordActive = true;
			else if((*i) == "-l")lineActive = true;
			else{
				cout << "wc: invalid option -- '" << (*i) << "'" << endl;	
				return false;
			}
		}
	}
	
	int byteTotal = 0, wordTotal = 0, lineTotal = 0;
	for(auto i = parameter.begin(); i != parameter.end(); i++){
		int t;
		if(GetFileType(*i) == DU_DIRECTORY){
			cout << "wc: " + (*i) + ": Is a directory" << endl;
			cout << "0 0 0 " + (*i) << endl;
			continue;
		}
		ifstream fin((*i).c_str(), ios::binary);
		if(!fin.is_open()){
			cout << "wc: " + (*i) + ": No such file or directory" << endl;
			continue;
		}
		else{
			if(lineActive){
				t = CntLine(*i);
				lineTotal += t;
				cout << t << ' ';
			}
			if(wordActive){
				t = CntWord(*i);
				wordTotal += t;
				cout << t << ' ';
			}
			if(byteActive){
				t = CntByte(*i);
				byteTotal += t;
				cout << t << ' ';
			}
			cout << (*i) << endl;
		}
	}

	if(parameter.size() > 1){
		if(lineActive)cout << lineTotal << ' ';
		if(wordActive)cout << wordTotal << ' ';
		if(byteActive)cout << byteTotal << ' ';
		cout << "total" << endl;
	}
	return true;
}